

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcSpfd.c
# Opt level: O0

Vec_Wrd_t * Bdc_SpfdDecomposeTest__(Vec_Int_t **pvWeights)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Bdc_Ent_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  int *piVar5;
  abctime aVar6;
  abctime aVar7;
  FILE *pFVar8;
  word *__ptr;
  FILE *local_108;
  ulong local_100;
  ulong local_f8;
  FILE *pFile_1;
  FILE *pFile;
  word t;
  word t1;
  word t0;
  Bdc_Ent_t *pThis1;
  Bdc_Ent_t *pThis0;
  Bdc_Ent_t *pEnd1;
  Bdc_Ent_t *pBeg1;
  Bdc_Ent_t *pEnd0;
  Bdc_Ent_t *pBeg0;
  Bdc_Ent_t *q;
  Bdc_Ent_t *p;
  Vec_Int_t *vWeights;
  Vec_Wrd_t *vTruths;
  Vec_Int_t *vStops;
  abctime clk2;
  abctime clk;
  int fCompl;
  int s;
  int k;
  int m;
  int n;
  int i;
  int *pPlace;
  int Limit;
  int nSize;
  int nFuncs;
  Vec_Int_t **pvWeights_local;
  
  aVar4 = Abc_Clock();
  printf("Allocating %.2f MB of internal memory.\n",0x40b65a0bc0000000);
  p_00 = (Bdc_Ent_t *)calloc(250000000,0x18);
  memset(p_00,0xff,0x18);
  p_00->iList = 0;
  for (pBeg0 = p_00; pBeg0 < p_00 + 250000000; pBeg0 = pBeg0 + 1) {
    pBeg0->iList = 0;
  }
  pBeg0 = p_00 + 1;
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,
         ((long)pBeg0 - (long)p_00) / 0x18 & 0xffffffff);
  p_01 = Vec_WrdStart(250000000);
  p_02 = Vec_IntStart(250000000);
  Vec_WrdClear(p_01);
  Vec_IntClear(p_02);
  p_03 = Vec_IntAlloc(10);
  Vec_IntPush(p_03,1);
  for (m = 0; m < 6; m = m + 1) {
    *(ulong *)pBeg0 = *(ulong *)pBeg0 & 0xffffffffe0000000 | 0x1fffffff;
    *(ulong *)pBeg0 = *(ulong *)pBeg0 & 0xe0000000ffffffff | ((ulong)(uint)m & 0x1fffffff) << 0x20;
    pBeg0->Truth = Truths[m];
    piVar5 = Bdc_SpfdHashLookup(p_00,0xc000013,pBeg0->Truth);
    *piVar5 = (int)(((long)pBeg0 - (long)p_00) / 0x18);
    pBeg0 = pBeg0 + 1;
    Vec_WrdPush(p_01,Truths[m]);
    Vec_IntPush(p_02,0);
  }
  Vec_IntPush(p_03,7);
  printf("Added %d + %d + 0 = %d. Total = %8d.\n",0,0,0,
         ((long)pBeg0 - (long)p_00) / 0x18 & 0xffffffff);
  k = 0;
  do {
    if (5 < k) {
      aVar6 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar6 - aVar4);
      pFVar8 = fopen("func6v6n_bin.txt","wb");
      __ptr = Vec_WrdArray(p_01);
      iVar1 = Vec_WrdSize(p_01);
      fwrite(__ptr,8,(long)iVar1,pFVar8);
      fclose(pFVar8);
      pFVar8 = fopen("func6v6nW_bin.txt","wb");
      piVar5 = Vec_IntArray(p_02);
      iVar1 = Vec_IntSize(p_02);
      fwrite(piVar5,4,(long)iVar1,pFVar8);
      fclose(pFVar8);
LAB_006e158c:
      Vec_IntFree(p_03);
      free(p_00);
      *pvWeights = p_02;
      return p_01;
    }
    for (fCompl = 0; fCompl < 6; fCompl = fCompl + 1) {
      for (s = 0; s < 6; s = s + 1) {
        if ((fCompl + s == k) && (fCompl <= s)) {
          iVar1 = Vec_IntEntry(p_03,fCompl);
          pThis1 = p_00 + iVar1;
          iVar1 = Vec_IntEntry(p_03,fCompl + 1);
          iVar2 = Vec_IntEntry(p_03,s);
          iVar3 = Vec_IntEntry(p_03,s + 1);
          aVar6 = Abc_Clock();
          printf("Trying %7d  x %7d.  ",((long)(p_00 + iVar1) - (long)pThis1) / 0x18 & 0xffffffff,
                 ((long)(p_00 + iVar3) - (long)(p_00 + iVar2)) / 0x18 & 0xffffffff);
          for (; t0 = (word)(p_00 + iVar2), pThis1 < p_00 + iVar1; pThis1 = pThis1 + 1) {
            for (; t0 < p_00 + iVar3; t0 = t0 + 0x18) {
              if ((fCompl < s) || (pThis1 < t0)) {
                for (clk._4_4_ = 0; (int)clk._4_4_ < 5; clk._4_4_ = clk._4_4_ + 1) {
                  if ((clk._4_4_ & 1) == 0) {
                    local_f8 = pThis1->Truth;
                  }
                  else {
                    local_f8 = pThis1->Truth ^ 0xffffffffffffffff;
                  }
                  if (((int)clk._4_4_ >> 1 & 1U) == 0) {
                    local_100 = *(ulong *)(t0 + 0x10);
                  }
                  else {
                    local_100 = *(ulong *)(t0 + 0x10) ^ 0xffffffffffffffff;
                  }
                  if (((int)clk._4_4_ >> 2 & 1U) == 0) {
                    local_108 = (FILE *)(local_f8 & local_100);
                  }
                  else {
                    local_108 = (FILE *)(local_f8 ^ local_100);
                  }
                  pFile = local_108;
                  if (((ulong)local_108 & 1) != 0) {
                    pFile = (FILE *)((ulong)local_108 ^ 0xffffffffffffffff);
                  }
                  if ((pFile != (FILE *)0x0) &&
                     (piVar5 = Bdc_SpfdHashLookup(p_00,0xc000013,(word)pFile), piVar5 != (int *)0x0)
                     ) {
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xffffffffe0000000 |
                         ((long)pThis1 - (long)p_00) / 0x18 & 0x1fffffffU;
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xffffffffdfffffff | (ulong)(clk._4_4_ & 1) << 0x1d;
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xe0000000ffffffff |
                         ((long)(t0 - (long)p_00) / 0x18 & 0x1fffffffU) << 0x20;
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xdfffffffffffffff |
                         (ulong)((int)clk._4_4_ >> 1 & 1) << 0x3d;
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xbfffffffffffffff |
                         (ulong)((int)clk._4_4_ >> 2 & 1) << 0x3e;
                    pBeg0->Truth = (word)pFile;
                    *(ulong *)pBeg0 =
                         *(ulong *)pBeg0 & 0xffffffffbfffffff | (ulong)((uint)local_108 & 1) << 0x1e
                    ;
                    *piVar5 = (int)(((long)pBeg0 - (long)p_00) / 0x18);
                    pBeg0 = pBeg0 + 1;
                    Vec_WrdPush(p_01,(word)pFile);
                    Vec_IntPush(p_02,k + 1);
                    if (((long)pBeg0 - (long)p_00) / 0x18 == 250000000) {
                      printf("Reached limit of %d functions.\n",250000000,
                             ((long)pBeg0 - (long)p_00) % 0x18);
                      goto LAB_006e158c;
                    }
                  }
                }
              }
            }
          }
          printf("Added %d + %d + 1 = %d. Total = %8d.   ",(ulong)(uint)fCompl,(ulong)(uint)s,
                 (ulong)(k + 1),((long)pBeg0 - (long)p_00) / 0x18 & 0xffffffff);
          aVar7 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar7 - aVar6);
        }
      }
    }
    Vec_IntPush(p_03,(int)(((long)pBeg0 - (long)p_00) / 0x18));
    k = k + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Bdc_SpfdDecomposeTest__( Vec_Int_t ** pvWeights )
{
//    int nFuncs = 8000000; // the number of functions to compute
//    int nSize  = 2777111; // the hash table size to use
//    int Limit  = 6;
    
//    int nFuncs = 51000000; // the number of functions to compute
//    int nSize  = 50331653; // the hash table size to use
//    int Limit  = 6;
    
    int nFuncs = 250000000; // the number of functions to compute
    int nSize  = 201326611; // the hash table size to use
    int Limit  = 6;

    int * pPlace, i, n, m, k, s, fCompl;
    abctime clk = Abc_Clock(), clk2;
    Vec_Int_t * vStops;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vWeights;
    Bdc_Ent_t * p, * q, * pBeg0, * pEnd0, * pBeg1, * pEnd1, * pThis0, * pThis1;
    word t0, t1, t;
    assert( nSize <= nFuncs );

    printf( "Allocating %.2f MB of internal memory.\n", 1.0*sizeof(Bdc_Ent_t)*nFuncs/(1<<20) );

    p = (Bdc_Ent_t *)calloc( nFuncs, sizeof(Bdc_Ent_t) );
    memset( p, 255, sizeof(Bdc_Ent_t) );
    p->iList = 0;
    for ( q = p; q < p+nFuncs; q++ )
       q->iList = 0;
    q = p + 1;
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    vTruths  = Vec_WrdStart( nFuncs );
    vWeights = Vec_IntStart( nFuncs );
    Vec_WrdClear( vTruths );
    Vec_IntClear( vWeights );

    // create elementary vars
    vStops = Vec_IntAlloc( 10 );
    Vec_IntPush( vStops, 1 );
    for ( i = 0; i < 6; i++ )
    {
        q->iFan0 = BDC_TERM;
        q->iFan1 = i;
        q->Truth = Truths[i];
        pPlace   = Bdc_SpfdHashLookup( p, nSize, q->Truth );
        *pPlace  = q-p;
        q++;
        Vec_WrdPush( vTruths, Truths[i] );
        Vec_IntPush( vWeights, 0 );
    }
    Vec_IntPush( vStops, 7 );
    printf( "Added %d + %d + 0 = %d. Total = %8d.\n", 0, 0, 0, (int)(q-p) );

    // create gates
    for ( n = 0; n < Limit; n++ )
    {
        // try previous
        for ( k = 0; k < Limit; k++ )
        for ( m = 0; m < Limit; m++ )
        {
            if ( k + m != n || k > m )
                continue;
            // set the start and stop
            pBeg0 = p + Vec_IntEntry( vStops, k );
            pEnd0 = p + Vec_IntEntry( vStops, k+1 );
            // set the start and stop
            pBeg1 = p + Vec_IntEntry( vStops, m );
            pEnd1 = p + Vec_IntEntry( vStops, m+1 );

            clk2 = Abc_Clock();
            printf( "Trying %7d  x %7d.  ", (int)(pEnd0-pBeg0), (int)(pEnd1-pBeg1) );
            for ( pThis0 = pBeg0; pThis0 < pEnd0; pThis0++ )
            for ( pThis1 = pBeg1; pThis1 < pEnd1; pThis1++ )
            if ( k < m || pThis1 > pThis0 )
//            if ( n < 5 || Bdc_SpfdCheckOverlap(p, pThis0, pThis1) )
            for ( s = 0; s < 5; s++ )
            {
                t0 = (s&1)      ? ~pThis0->Truth : pThis0->Truth;
                t1 = ((s>>1)&1) ? ~pThis1->Truth : pThis1->Truth;
                t  = ((s>>2)&1) ? t0 ^ t1 : t0 & t1;
                fCompl = t & 1;
                if ( fCompl )
                    t = ~t;
                if ( t == 0 )
                    continue;
                pPlace = Bdc_SpfdHashLookup( p, nSize, t );
                if ( pPlace == NULL )
                    continue;
                q->iFan0   = pThis0-p;
                q->fCompl0 = s&1;
                q->iFan1   = pThis1-p;
                q->fCompl1 = (s>>1)&1;
                q->fExor   = (s>>2)&1;
                q->Truth   = t;
                q->fCompl  = fCompl;
                *pPlace = q-p;
                q++;
                Vec_WrdPush( vTruths, t );
//                Vec_IntPush( vWeights, n == 5 ? n : n+1 );
                Vec_IntPush( vWeights, n+1 );
                if ( q-p == nFuncs )
                {
                    printf( "Reached limit of %d functions.\n", nFuncs );
                    goto finish;
                }
            }
            printf( "Added %d + %d + 1 = %d. Total = %8d.   ", k, m, n+1, (int)(q-p) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
        Vec_IntPush( vStops, q-p );
    }
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );


    {
        FILE * pFile = fopen( "func6v6n_bin.txt", "wb" );
        fwrite( Vec_WrdArray(vTruths), sizeof(word), Vec_WrdSize(vTruths), pFile );
        fclose( pFile );
    }
    {
        FILE * pFile = fopen( "func6v6nW_bin.txt", "wb" );
        fwrite( Vec_IntArray(vWeights), sizeof(int), Vec_IntSize(vWeights), pFile );
        fclose( pFile );
    }


finish:
    Vec_IntFree( vStops );
    free( p );

    *pvWeights = vWeights;
//    Vec_WrdFree( vTruths );
    return vTruths;
}